

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeArrayIteratorPrototype
               (DynamicObject *arrayIteratorPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  code *pcVar1;
  bool bVar2;
  JavascriptLibrary *this;
  ScriptContext *this_00;
  undefined4 *puVar3;
  JavascriptFunction *ptr;
  ScriptConfiguration *this_01;
  JavascriptString *value;
  ScriptContext *scriptContext;
  JavascriptLibrary *library;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *arrayIteratorPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,arrayIteratorPrototype,mode,2,0);
  this = RecyclableObject::GetLibrary(&arrayIteratorPrototype->super_RecyclableObject);
  this_00 = GetScriptContext(this);
  bVar2 = ScriptContext::IsJsBuiltInEnabled(this_00);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                ,0x1275,"(!scriptContext->IsJsBuiltInEnabled())",
                                "!scriptContext->IsJsBuiltInEnabled()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ptr = AddFunctionToLibraryObject
                  (this,arrayIteratorPrototype,0x107,
                   (FunctionInfo *)JavascriptArrayIterator::EntryInfo::Next,0,'\x06');
  Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=
            (&(this->super_JavascriptLibraryBase).arrayIteratorPrototypeBuiltinNextFunction,ptr);
  this_01 = ScriptContext::GetConfig(this_00);
  bVar2 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar2) {
    value = CreateStringFromCppLiteral<15ul>(this,(char16 (*) [15])L"Array Iterator");
    AddMember(this,arrayIteratorPrototype,0x1b,value,'\x02');
  }
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeArrayIteratorPrototype(DynamicObject* arrayIteratorPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {

        typeHandler->Convert(arrayIteratorPrototype, mode, 2);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterArrayIterator
        // so that the update is in sync with profiler

        JavascriptLibrary* library = arrayIteratorPrototype->GetLibrary();
        ScriptContext* scriptContext = library->GetScriptContext();

#ifdef ENABLE_JS_BUILTINS
        Assert(!scriptContext->IsJsBuiltInEnabled());
#endif

        library->arrayIteratorPrototypeBuiltinNextFunction = library->AddFunctionToLibraryObject(arrayIteratorPrototype, PropertyIds::next, &JavascriptArrayIterator::EntryInfo::Next, 0);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(arrayIteratorPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Array Iterator")), PropertyConfigurable);
        }

        return true;
    }